

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

void activate_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table,_Bool active)

{
  ecs_vector_t *peVar1;
  bool bVar2;
  ecs_table_t *table_00;
  byte bVar3;
  int32_t iVar4;
  long *plVar5;
  long lVar6;
  void *pvVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  long lVar9;
  uint index;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ecs_vector_t *dst_array;
  ecs_vector_t *local_70;
  uint local_68;
  uint local_64;
  ecs_world_t *local_60;
  ecs_vector_t *local_58;
  ecs_query_t *local_50;
  long local_48;
  long *local_40;
  ecs_table_t *local_38;
  
  uVar8 = CONCAT71(in_register_00000009,active);
  uVar10 = uVar8 & 0xffffffff;
  bVar3 = (byte)uVar10;
  peVar1 = (&query->tables)[uVar8 & 0xffffffff];
  local_70 = (&query->tables)[bVar3 ^ 1];
  local_38 = table;
  plVar5 = (long *)_ecs_map_get(query->table_indices,0x10,(ulong)table->id);
  table_00 = local_38;
  if (plVar5 == (long *)0x0) {
LAB_001191f8:
    _ecs_assert((_Bool)((byte)(query->flags >> 8) & 1),0xc,(char *)0x0,
                "(query->flags & EcsQueryIsSubquery) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x716);
    if ((query->flags & 0x100) == 0) {
      __assert_fail("(query->flags & (256)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x716,"void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)"
                   );
    }
  }
  else {
    lVar6 = (long)(int)plVar5[1];
    bVar2 = true;
    if (lVar6 < 1) {
LAB_001191e0:
      if (bVar3 == 0) {
        query->empty_tables = local_70;
      }
      else {
        query->tables = local_70;
      }
      if (bVar2) goto LAB_001191f8;
    }
    else {
      lVar9 = *plVar5;
      lVar12 = 0;
      local_68 = (uint)active;
      iVar11 = 0;
      local_64 = (uint)uVar8;
      local_60 = world;
      local_58 = peVar1;
      local_50 = query;
      local_48 = lVar6;
      local_40 = plVar5;
      do {
        peVar1 = local_58;
        index = *(uint *)(lVar9 + lVar12 * 4);
        if ((int)index < 0) {
          if ((char)uVar10 != '\0') {
            index = ~index;
            goto LAB_00119101;
          }
        }
        else if ((char)uVar10 == '\0') {
LAB_00119101:
          pvVar7 = _ecs_vector_get(local_58,0x50,0x10,index);
          _ecs_assert(*(ecs_table_t **)((long)pvVar7 + 8) == table_00,0xc,(char *)0x0,
                      "mt->iter_data.table == table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x6f2);
          query = local_50;
          if (*(ecs_table_t **)((long)pvVar7 + 8) != table_00) {
            __assert_fail("mt->iter_data.table == table",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x6f2,
                          "void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)")
            ;
          }
          iVar11 = iVar11 + 1;
          iVar4 = move_table(local_50,table_00,index,&local_70,peVar1,SUB41(local_68,0));
          lVar9 = *local_40;
          *(int32_t *)(lVar9 + lVar12 * 4) = iVar4;
          uVar10 = (ulong)local_64;
          lVar6 = local_48;
        }
        bVar3 = (byte)uVar10;
        lVar12 = lVar12 + 1;
      } while (lVar6 != lVar12);
      bVar2 = true;
      if (iVar11 == 0) goto LAB_001191e0;
      if (query->system == 0) {
        bVar2 = false;
        goto LAB_001191e0;
      }
      iVar4 = ecs_vector_count(local_70);
      if (bVar3 == 0) {
        iVar4 = ecs_vector_count(local_58);
        if (iVar4 == 0) {
          ecs_system_activate(local_60,query->system,false,(EcsSystem *)0x0);
        }
        query->empty_tables = local_70;
      }
      else {
        if (iVar4 == 1) {
          ecs_system_activate(local_60,query->system,true,(EcsSystem *)0x0);
        }
        query->tables = local_70;
      }
    }
    query->needs_reorder = true;
  }
  return;
}

Assistant:

static
void activate_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table,
    bool active)
{
    (void)world;
    
    ecs_vector_t *src_array, *dst_array;
    int32_t activated = 0;

    if (active) {
        src_array = query->empty_tables;
        dst_array = query->tables;
    } else {
        src_array = query->tables;
        dst_array = query->empty_tables;
    }

    ecs_table_indices_t *ti = ecs_map_get(
        query->table_indices, ecs_table_indices_t, table->id);

    if (ti) {
        int32_t i, count = ti->count;
        for (i = 0; i < count; i ++) {
            int32_t index = ti->indices[i];

            if (index < 0) {
                if (!active) {
                    /* If table is already inactive, no need to move */
                    continue;
                }
                index = index * -1 - 1;
            } else {
                if (active) {
                    /* If table is already active, no need to move */
                    continue;
                }
            }

            ecs_matched_table_t *mt = ecs_vector_get(
                src_array, ecs_matched_table_t, index);
            ecs_assert(mt->iter_data.table == table, ECS_INTERNAL_ERROR, NULL);
            (void)mt;
            
            activated ++;

            ti->indices[i] = move_table(
                query, table, index, &dst_array, src_array, active);
        }

        if (activated) {
            /* Activate system if registered with query */
#ifdef FLECS_SYSTEMS_H
            if (query->system) {
                int32_t dst_count = ecs_vector_count(dst_array);
                if (active) {
                    if (dst_count == 1) {
                        ecs_system_activate(world, query->system, true, NULL);
                    }
                } else if (ecs_vector_count(src_array) == 0) {
                    ecs_system_activate(world, query->system, false, NULL);
                }
            }
#endif
        }

        if (active)  {
            query->tables = dst_array;
        } else {
            query->empty_tables = dst_array;
        }
    }
    
    if (!activated) {
        /* Received an activate event for a table we're not matched with. This
         * can only happen if this is a subquery */
        ecs_assert((query->flags & EcsQueryIsSubquery) != 0, 
            ECS_INTERNAL_ERROR, NULL);
        return;
    }

    /* Signal query it needs to reorder tables. Doing this in place could slow
     * down scenario's where a large number of tables is matched with an ordered
     * query. Since each table would trigger the activate signal, there would be
     * as many sorts as added tables, vs. only one when ordering happens when an
     * iterator is obtained. */
    query->needs_reorder = true;
}